

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O0

intptr_t __thiscall Lowerer::GetObjRefForBuiltInTarget(Lowerer *this,RegOpnd *regOpnd)

{
  code *pcVar1;
  long lVar2;
  bool bVar3;
  _E _Var4;
  int iVar5;
  ScriptContextInfo *pSVar6;
  undefined4 extraout_var;
  undefined4 *puVar7;
  BuiltinFunction local_21;
  long lStack_20;
  BuiltinFunction index;
  intptr_t mathFns;
  RegOpnd *regOpnd_local;
  Lowerer *this_local;
  
  pSVar6 = Func::GetScriptContextInfo(this->m_func);
  iVar5 = (*pSVar6->_vptr_ScriptContextInfo[0x1f])();
  lStack_20 = CONCAT44(extraout_var,iVar5);
  local_21._value = (regOpnd->m_sym->m_builtInIndex)._value;
  bVar3 = Js::BuiltinFunction::operator<(&local_21,Count);
  if (!bVar3) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x2f0a,"(index < Js::BuiltinFunction::Count)",
                       "Invalid built-in index on a call target marked as built-in");
    if (!bVar3) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 0;
  }
  lVar2 = lStack_20;
  _Var4 = Js::BuiltinFunction::operator_cast_to__E(&local_21);
  return lVar2 + (ulong)_Var4;
}

Assistant:

intptr_t
Lowerer::GetObjRefForBuiltInTarget(IR::RegOpnd * regOpnd)
{
    intptr_t mathFns = m_func->GetScriptContextInfo()->GetBuiltinFunctionsBaseAddr();
    Js::BuiltinFunction index = regOpnd->m_sym->m_builtInIndex;

    AssertMsg(index < Js::BuiltinFunction::Count, "Invalid built-in index on a call target marked as built-in");

    return mathFns + index;
}